

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O2

CTcPrsGramNode * __thiscall CTcPrsGramNodeCat::consolidate_or(CTcPrsGramNodeCat *this)

{
  CTcPrsGramNode **ppCVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  CTcPrsGramNode *pCVar5;
  CTcTokenSource *pCVar6;
  CTcTokenSource *pCVar7;
  CTcPrsGramNode *pCVar8;
  CTcPrsGramNode **ppCVar9;
  CTcTokenSource **ppCVar10;
  CTcPrsGramNode *pCVar4;
  undefined4 extraout_var_00;
  
  ppCVar1 = &(this->super_CTcPrsGramNodeWithChildren).sub_head_;
  pCVar5 = (this->super_CTcPrsGramNodeWithChildren).sub_head_;
  (this->super_CTcPrsGramNodeWithChildren).sub_head_ = (CTcPrsGramNode *)0x0;
  (this->super_CTcPrsGramNodeWithChildren).sub_tail_ = (CTcPrsGramNode *)0x0;
  while (pCVar5 != (CTcPrsGramNode *)0x0) {
    pCVar6 = &pCVar5->super_CTcTokenSource;
    pCVar5 = pCVar5->next_;
    iVar2 = (*pCVar6->_vptr_CTcTokenSource[3])();
    pCVar4 = (CTcPrsGramNode *)CONCAT44(extraout_var,iVar2);
    pCVar8 = (this->super_CTcPrsGramNodeWithChildren).sub_tail_;
    ppCVar9 = &pCVar8->next_;
    if (pCVar8 == (CTcPrsGramNode *)0x0) {
      ppCVar9 = ppCVar1;
    }
    *ppCVar9 = pCVar4;
    (this->super_CTcPrsGramNodeWithChildren).sub_tail_ = pCVar4;
    pCVar4->next_ = (CTcPrsGramNode *)0x0;
  }
  iVar2 = 0;
  ppCVar9 = ppCVar1;
  while (pCVar5 = *ppCVar9, pCVar5 != (CTcPrsGramNode *)0x0) {
    iVar3 = (*(pCVar5->super_CTcTokenSource)._vptr_CTcTokenSource[5])(pCVar5);
    iVar2 = (iVar2 + 1) - (uint)(iVar3 == 0);
    ppCVar9 = &pCVar5->next_;
  }
  if (iVar2 != 0) {
    pCVar5 = (CTcPrsGramNode *)CTcPrsMem::alloc(G_prsmem,0x88);
    (pCVar5->super_CTcTokenSource).enclosing_src_ = (CTcTokenSource *)0x0;
    *(undefined8 *)&(pCVar5->super_CTcTokenSource).enclosing_curtok_ = 0;
    (pCVar5->super_CTcTokenSource).enclosing_curtok_.text_ = (char *)0x0;
    (pCVar5->super_CTcTokenSource).enclosing_curtok_.text_len_ = 0;
    (pCVar5->super_CTcTokenSource).enclosing_curtok_.int_val_ = 0;
    *(undefined8 *)&(pCVar5->super_CTcTokenSource).enclosing_curtok_.field_0x20 = 0;
    pCVar5->next_ = (CTcPrsGramNode *)0x0;
    pCVar5[1].super_CTcTokenSource._vptr_CTcTokenSource = (_func_int **)0x0;
    pCVar5[1].super_CTcTokenSource.enclosing_src_ = (CTcTokenSource *)0x0;
    *(undefined8 *)&pCVar5[1].super_CTcTokenSource.enclosing_curtok_ = 0;
    pCVar5[1].super_CTcTokenSource.enclosing_curtok_.text_ = (char *)0x0;
    pCVar5[1].super_CTcTokenSource.enclosing_curtok_.text_len_ = 0;
    pCVar5[1].super_CTcTokenSource.enclosing_curtok_.int_val_ = 0;
    *(undefined8 *)&pCVar5[1].super_CTcTokenSource.enclosing_curtok_.field_0x20 = 0;
    pCVar5[1].next_ = (CTcPrsGramNode *)0x0;
    pCVar5[2].super_CTcTokenSource._vptr_CTcTokenSource = 0;
    (pCVar5->super_CTcTokenSource)._vptr_CTcTokenSource =
         (_func_int **)&PTR__CTcTokenSource_0030de28;
    ppCVar9 = ppCVar1;
    while (pCVar8 = *ppCVar9, pCVar8 != (CTcPrsGramNode *)0x0) {
      (*(pCVar8->super_CTcTokenSource)._vptr_CTcTokenSource[8])(pCVar8);
      ppCVar9 = &pCVar8->next_;
    }
    do {
      pCVar6 = (CTcTokenSource *)CTcPrsMem::alloc(G_prsmem,0x58);
      pCVar6->enclosing_src_ = (CTcTokenSource *)0x0;
      *(undefined8 *)&pCVar6->enclosing_curtok_ = 0;
      (pCVar6->enclosing_curtok_).text_ = (char *)0x0;
      (pCVar6->enclosing_curtok_).text_len_ = 0;
      (pCVar6->enclosing_curtok_).int_val_ = 0;
      *(undefined8 *)&(pCVar6->enclosing_curtok_).field_0x20 = 0;
      pCVar6[1]._vptr_CTcTokenSource = (_func_int **)0x0;
      pCVar6[1].enclosing_src_ = (CTcTokenSource *)0x0;
      *(undefined8 *)&pCVar6[1].enclosing_curtok_ = 0;
      pCVar6[1].enclosing_curtok_.text_ = (char *)0x0;
      pCVar6->_vptr_CTcTokenSource = (_func_int **)&PTR__CTcTokenSource_0030d4e0;
      ppCVar9 = ppCVar1;
      while (pCVar8 = *ppCVar9, pCVar8 != (CTcPrsGramNode *)0x0) {
        iVar2 = (*(pCVar8->super_CTcTokenSource)._vptr_CTcTokenSource[10])(pCVar8);
        pCVar7 = (CTcTokenSource *)CONCAT44(extraout_var_00,iVar2);
        ppCVar10 = (CTcTokenSource **)(*(long *)&pCVar6[1].enclosing_curtok_ + 0x38);
        if (*(long *)&pCVar6[1].enclosing_curtok_ == 0) {
          ppCVar10 = &pCVar6[1].enclosing_src_;
        }
        *ppCVar10 = pCVar7;
        *(CTcTokenSource **)&pCVar6[1].enclosing_curtok_ = pCVar7;
        pCVar7[1]._vptr_CTcTokenSource = (_func_int **)0x0;
        ppCVar9 = &pCVar8->next_;
      }
      pCVar7 = pCVar5[1].super_CTcTokenSource.enclosing_src_;
      pCVar8 = (CTcPrsGramNode *)(pCVar7 + 1);
      if (pCVar7 == (CTcTokenSource *)0x0) {
        pCVar8 = pCVar5 + 1;
      }
      *(CTcTokenSource **)&pCVar8->super_CTcTokenSource = pCVar6;
      pCVar5[1].super_CTcTokenSource.enclosing_src_ = pCVar6;
      pCVar6[1]._vptr_CTcTokenSource = (_func_int **)0x0;
      ppCVar9 = ppCVar1;
      do {
        pCVar8 = *ppCVar9;
        if (pCVar8 == (CTcPrsGramNode *)0x0) {
          return pCVar5;
        }
        iVar2 = (*(pCVar8->super_CTcTokenSource)._vptr_CTcTokenSource[9])(pCVar8);
        ppCVar9 = &pCVar8->next_;
      } while (iVar2 != 0);
    } while( true );
  }
  return (CTcPrsGramNode *)this;
}

Assistant:

CTcPrsGramNode *CTcPrsGramNodeCat::consolidate_or()
{
    CTcPrsGramNode *old_head;
    CTcPrsGramNodeOr *new_or;
    CTcPrsGramNode *cur;
    CTcPrsGramNode *nxt;
    int or_cnt;

    /* 
     *   Consolidate OR's in all subtrees.  Before we do, stash away our
     *   entire subtree, since we'll rebuild the tree from the updated
     *   versions.  
     */
    old_head = sub_head_;
    sub_head_ = sub_tail_ = 0;

    /* run through our old list and build the new, consolidated list */
    for (cur = old_head ; cur != 0 ; cur = nxt)
    {
        /* remember the next item in the old list */
        nxt = cur->next_;

        /* consolidate the subtree and add it to our new list */
        add_sub_item(cur->consolidate_or());
    }

    /* 
     *   Count of OR nodes - if we don't have any, we don't have to make any
     *   changes.  Since we've already consolidated all OR's out of
     *   sub-nodes into a single node at the top of each subtree, we don't
     *   have to worry about OR's below our immediate children.  
     */
    for (or_cnt = 0, cur = sub_head_ ; cur != 0 ; cur = cur->next_)
    {
        /* if it's an OR node, count it */
        if (cur->is_or())
            ++or_cnt;
    }

    /* if we have no OR nodes, we need no changes */
    if (or_cnt == 0)
        return this;

    /* create a new OR node to contain the list of expansions */
    new_or = new (G_prsmem) CTcPrsGramNodeOr();

    /* set up each OR node with the next alternative */
    for (cur = sub_head_ ; cur != 0 ; cur = cur->next_)
        cur->init_expansion();

    /*
     *   Iterate through all of the possibilities.  For each iteration,
     *   we'll build the currently selected alternative, then we'll advance
     *   by one alternative.  We'll keep doing this until we've advanced
     *   through all of the alternatives.  
     */
    for (;;)
    {
        CTcPrsGramNodeCat *new_cat;

        /* create a new CAT node for the current selected alternative */
        new_cat = new (G_prsmem) CTcPrsGramNodeCat();

        /* clone and add each current alternative to the new CAT node */
        for (cur = sub_head_ ; cur != 0 ; cur = cur->next_)
            new_cat->add_sub_item(cur->clone_expansion());

        /* 
         *   we've finished this entire expansion, so add it to the new main
         *   OR we're building 
         */
        new_or->add_sub_item(new_cat);

        /*
         *   Go through the list of subitems and advance to the next OR
         *   state.  Stop when we reach the first item that advances without
         *   a 'carry'.  If we're still carrying when we reach the last
         *   item, we know we've wrapped around back to the first
         *   alternative and hence are done.  
         */
        for (cur = sub_head_ ; cur != 0 ; cur = cur->next_)
        {
            /* advance this one; if it doesn't carry, we're done */
            if (!cur->advance_expansion())
                break;
        }

        /* 
         *   if we carried past the last item, we've wrapped around back to
         *   the first alternative, so we're done 
         */
        if (cur == 0)
            break;
    }
    
    /* return the new main OR we built */
    return new_or;
}